

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLLinOp.cpp
# Opt level: O1

void __thiscall
amrex::MLLinOp::define
          (MLLinOp *this,Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *a_geom,
          Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *a_grids,
          Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_> *a_dmap,
          LPInfo *a_info,
          Vector<const_amrex::FabFactory<amrex::FArrayBox>_*,_std::allocator<const_amrex::FabFactory<amrex::FArrayBox>_*>_>
          *a_factory,bool eb_limit_coarsening)

{
  pointer ppFVar1;
  FabFactory<amrex::FArrayBox> *pFVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  bool bVar7;
  bool bVar8;
  undefined1 uVar9;
  bool bVar10;
  undefined3 uVar11;
  int iVar12;
  EBFArrayBoxFactory *this_00;
  int iVar13;
  
  if ((anonymous_namespace)::initialized == '\0') {
    Initialize();
  }
  bVar7 = a_info->do_consolidation;
  bVar8 = a_info->do_semicoarsening;
  uVar9 = a_info->field_0x3;
  iVar13 = a_info->agg_grid_size;
  iVar12 = a_info->con_grid_size;
  bVar10 = a_info->has_metric_term;
  uVar11 = *(undefined3 *)&a_info->field_0xd;
  iVar3 = a_info->max_coarsening_level;
  iVar4 = a_info->max_semicoarsening_level;
  iVar5 = a_info->semicoarsening_direction;
  iVar6 = a_info->hidden_direction;
  (this->info).do_agglomeration = a_info->do_agglomeration;
  (this->info).do_consolidation = bVar7;
  (this->info).do_semicoarsening = bVar8;
  (this->info).field_0x3 = uVar9;
  (this->info).agg_grid_size = iVar13;
  (this->info).con_grid_size = iVar12;
  (this->info).has_metric_term = bVar10;
  *(undefined3 *)&(this->info).field_0xd = uVar11;
  (this->info).max_coarsening_level = iVar3;
  (this->info).max_semicoarsening_level = iVar4;
  (this->info).semicoarsening_direction = iVar5;
  (this->info).hidden_direction = iVar6;
  if ((this->info).agg_grid_size < 1) {
    (this->info).agg_grid_size = 8;
  }
  if ((this->info).con_grid_size < 1) {
    (this->info).con_grid_size = 8;
  }
  ppFVar1 = (a_factory->
            super_vector<const_amrex::FabFactory<amrex::FArrayBox>_*,_std::allocator<const_amrex::FabFactory<amrex::FArrayBox>_*>_>
            ).
            super__Vector_base<const_amrex::FabFactory<amrex::FArrayBox>_*,_std::allocator<const_amrex::FabFactory<amrex::FArrayBox>_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (eb_limit_coarsening &&
      ppFVar1 !=
      (a_factory->
      super_vector<const_amrex::FabFactory<amrex::FArrayBox>_*,_std::allocator<const_amrex::FabFactory<amrex::FArrayBox>_*>_>
      ).
      super__Vector_base<const_amrex::FabFactory<amrex::FArrayBox>_*,_std::allocator<const_amrex::FabFactory<amrex::FArrayBox>_*>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pFVar2 = *ppFVar1;
    if (pFVar2 == (FabFactory<amrex::FArrayBox> *)0x0) {
      this_00 = (EBFArrayBoxFactory *)0x0;
    }
    else {
      this_00 = (EBFArrayBoxFactory *)
                __dynamic_cast(pFVar2,&FabFactory<amrex::FArrayBox>::typeinfo,
                               &EBFArrayBoxFactory::typeinfo,0);
    }
    if (this_00 != (EBFArrayBoxFactory *)0x0) {
      iVar12 = EBFArrayBoxFactory::maxCoarseningLevel(this_00);
      iVar13 = (this->info).max_coarsening_level;
      if (iVar12 < iVar13) {
        iVar13 = iVar12;
      }
      (this->info).max_coarsening_level = iVar13;
    }
  }
  defineGrids(this,a_geom,a_grids,a_dmap,a_factory);
  this->m_needs_coarse_data_for_bc =
       *(this->m_domain_covered).super_vector<int,_std::allocator<int>_>.
        super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start == 0;
  return;
}

Assistant:

void
MLLinOp::define (const Vector<Geometry>& a_geom,
                 const Vector<BoxArray>& a_grids,
                 const Vector<DistributionMapping>& a_dmap,
                 const LPInfo& a_info,
                 const Vector<FabFactory<FArrayBox> const*>& a_factory,
                 bool eb_limit_coarsening)
{
    amrex::ignore_unused(eb_limit_coarsening);

    BL_PROFILE("MLLinOp::define()");

    if (!initialized) {
        Initialize();
    }

    info = a_info;
#ifdef AMREX_USE_GPU
    if (Gpu::notInLaunchRegion())
    {
        if (info.agg_grid_size <= 0) info.agg_grid_size = AMREX_D_PICK(32, 16, 8);
        if (info.con_grid_size <= 0) info.con_grid_size = AMREX_D_PICK(32, 16, 8);
    }
    else
#endif
    {
        if (info.agg_grid_size <= 0) info.agg_grid_size = LPInfo::getDefaultAgglomerationGridSize();
        if (info.con_grid_size <= 0) info.con_grid_size = LPInfo::getDefaultConsolidationGridSize();
    }

#ifdef AMREX_USE_EB
    if (!a_factory.empty() && eb_limit_coarsening) {
        auto f = dynamic_cast<EBFArrayBoxFactory const*>(a_factory[0]);
        if (f) {
            info.max_coarsening_level = std::min(info.max_coarsening_level,
                                                 f->maxCoarseningLevel());
        }
    }
#endif
    defineGrids(a_geom, a_grids, a_dmap, a_factory);
    defineAuxData();
    defineBC();
}